

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterset.cpp
# Opt level: O0

void __thiscall ParameterSet::addParameter(ParameterSet *this,string *_name,bool _defaultValue)

{
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Type>_>::value,_pair<iterator,_bool>_>
  _Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_98;
  _Base_ptr local_70;
  undefined1 local_68;
  Type local_4c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>
  local_48;
  bool local_19;
  string *psStack_18;
  bool _defaultValue_local;
  string *_name_local;
  ParameterSet *this_local;
  
  local_4c = BOOL;
  local_19 = _defaultValue;
  psStack_18 = _name;
  _name_local = &this->name_;
  std::make_pair<std::__cxx11::string_const&,Type>(&local_48,_name,&local_4c);
  _Var1 = std::
          map<std::__cxx11::string,Type,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
          ::insert<std::pair<std::__cxx11::string,Type>>
                    ((map<std::__cxx11::string,Type,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
                      *)&this->type_dict,&local_48);
  local_70 = (_Base_ptr)_Var1.first._M_node;
  local_68 = _Var1.second;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>::
  ~pair(&local_48);
  std::make_pair<std::__cxx11::string_const&,bool&>(&local_98,psStack_18,&local_19);
  std::
  map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::insert<std::pair<std::__cxx11::string,bool>>
            ((map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
              *)&this->bool_dict,&local_98);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  ~pair(&local_98);
  return;
}

Assistant:

void ParameterSet::addParameter(const string &_name, bool _defaultValue)
{
    type_dict.insert(std::make_pair(_name, BOOL));
    bool_dict.insert(std::make_pair(_name, _defaultValue));
}